

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

reentrant_put_transaction<void> *
density_tests::detail::
PutTestObject<density::conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>,_128UL,_8UL>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *param_2)

{
  TestObject<128UL,_8UL> local_e0;
  reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_> local_60;
  undefined1 local_40 [8];
  reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_> transaction;
  EasyRandom *param_1_local;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *i_queue_local;
  
  transaction.m_put_transaction.m_put_data.m_user_storage = param_2;
  TestObject<128UL,_8UL>::TestObject(&local_e0);
  density::
  conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
  ::start_reentrant_push<density_tests::TestObject<128ul,8ul>>
            (&local_60,
             (conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
              *)i_queue,&local_e0);
  density::
  conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
  ::reentrant_put_transaction<density_tests::TestObject<128ul,8ul>>::
  reentrant_put_transaction<density_tests::TestObject<128ul,8ul>,void>
            ((reentrant_put_transaction<density_tests::TestObject<128ul,8ul>> *)local_40,&local_60);
  density::
  conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
  ::reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_>::~reentrant_put_transaction
            (&local_60);
  TestObject<128UL,_8UL>::~TestObject(&local_e0);
  exception_checkpoint();
  density::
  conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>>
  ::reentrant_put_transaction<void>::
  reentrant_put_transaction<density_tests::TestObject<128ul,8ul>,void>
            ((reentrant_put_transaction<void> *)__return_storage_ptr__,
             (reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_> *)local_40);
  density::
  conc_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>_>
  ::reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_>::~reentrant_put_transaction
            ((reentrant_put_transaction<density_tests::TestObject<128UL,_8UL>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                auto transaction = i_queue.start_reentrant_push(ElementType());
                exception_checkpoint();
                return std::move(transaction);
            }